

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

ZoneState * QDateTimePrivate::expressUtcAsLocal(ZoneState *__return_storage_ptr__,qint64 utcMSecs)

{
  bool bVar1;
  int year;
  qint64 jd;
  longlong *plVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  YearMonthDay YVar5;
  optional<long_long> oVar6;
  _Storage<long_long,_true> local_60;
  undefined1 *local_58;
  ZoneState local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->valid = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->when = utcMSecs;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->dst = UnknownDaylightTime;
  __return_storage_ptr__->valid = false;
  bVar1 = millisInSystemRange(utcMSecs,0);
  if (bVar1) {
    QLocalTime::utcToLocal(&local_50,utcMSecs);
    __return_storage_ptr__->valid = local_50.valid;
    __return_storage_ptr__->when = local_50.when;
    __return_storage_ptr__->offset = local_50.offset;
    __return_storage_ptr__->dst = local_50.dst;
    if (__return_storage_ptr__->valid != false) goto LAB_00126611;
  }
  jd = msecsToJulianDay(utcMSecs);
  YVar5 = QGregorianCalendar::partsFromJulian(jd);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  year = systemTimeYearMatching(YVar5.year);
  oVar6 = QGregorianCalendar::julianFromParts(year,YVar5.month,YVar5.day);
  local_60._M_value =
       oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  local_58 = (undefined1 *)
             CONCAT71(local_58._1_7_,
                      oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
                      super__Optional_payload_base<long_long>._M_engaged);
  if (((undefined1  [16])
       oVar6.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    plVar2 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::
             _M_get((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *)
                    &local_60);
    lVar4 = jd - *plVar2;
    lVar3 = lVar4 * 86400000;
    if ((SEXT816(lVar3) == SEXT816(lVar4) * SEXT416(86400000)) && (!SBORROW8(utcMSecs,lVar3))) {
      QLocalTime::utcToLocal(&local_50,utcMSecs + lVar4 * -86400000);
      __return_storage_ptr__->valid = local_50.valid;
      __return_storage_ptr__->when = local_50.when;
      __return_storage_ptr__->offset = local_50.offset;
      __return_storage_ptr__->dst = local_50.dst;
      if ((__return_storage_ptr__->valid != true) ||
         (lVar4 = __return_storage_ptr__->when,
         __return_storage_ptr__->when = __return_storage_ptr__->when + lVar3, SCARRY8(lVar4,lVar3)))
      {
        __return_storage_ptr__->when = utcMSecs;
        __return_storage_ptr__->valid = false;
      }
    }
  }
LAB_00126611:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState QDateTimePrivate::expressUtcAsLocal(qint64 utcMSecs)
{
    ZoneState result{utcMSecs};
    // Within the time_t supported range, localtime() can handle it:
    if (millisInSystemRange(utcMSecs)) {
        result = QLocalTime::utcToLocal(utcMSecs);
        if (result.valid)
            return result;
    }

    // Docs state any LocalTime after 2038-01-18 *will* have any DST applied.
    // When this falls outside the supported range, we need to fake it.
#if QT_CONFIG(timezone) // Use the system time-zone.
    if (const auto sys = QTimeZone::systemTimeZone(); sys.isValid()) {
        result.offset = sys.d->offsetFromUtc(utcMSecs);
        if (result.offset != QTimeZonePrivate::invalidSeconds()) {
            if (qAddOverflow(utcMSecs, result.offset * MSECS_PER_SEC, &result.when))
                return result;
            result.dst = sys.d->isDaylightTime(utcMSecs) ? DaylightTime : StandardTime;
            result.valid = true;
            return result;
        }
    }
#endif // timezone

    // Kludge
    // Do the conversion in a year with the same days of the week, so DST
    // dates might be right, and adjust by the number of days that was off:
    const qint64 jd = msecsToJulianDay(utcMSecs);
    const auto ymd = QGregorianCalendar::partsFromJulian(jd);
    qint64 diffMillis, fakeUtc;
    const auto fakeJd = QGregorianCalendar::julianFromParts(systemTimeYearMatching(ymd.year),
                                                            ymd.month, ymd.day);
    if (Q_UNLIKELY(!fakeJd
                   || qMulOverflow(jd - *fakeJd, std::integral_constant<qint64, MSECS_PER_DAY>(),
                                   &diffMillis)
                   || qSubOverflow(utcMSecs, diffMillis, &fakeUtc))) {
        return result;
    }

    result = QLocalTime::utcToLocal(fakeUtc);
    // Now correct result.when for the use of the fake date:
    if (!result.valid || qAddOverflow(result.when, diffMillis, &result.when)) {
        // If utcToLocal() failed, its return has the fake when; restore utcMSecs.
        // Fail on overflow, but preserve offset and DST-ness.
        result.when = utcMSecs;
        result.valid = false;
    }
    return result;
}